

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::ProtectUnusablePages
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DWORD local_24;
  BOOL ret;
  DWORD oldProtect;
  char *startPage;
  size_t count;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  count = (size_t)this;
  uVar3 = GetUnusablePageCount(this);
  startPage = (char *)(ulong)uVar3;
  if (startPage != (char *)0x0) {
    _ret = (this->super_HeapBlock).address + (8 - (long)startPage) * 0x1000;
    BVar4 = VirtualProtect(_ret,(long)startPage << 0xc,2,&local_24);
    if ((BVar4 == 0) || (local_24 != 4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0xc3,"(ret && oldProtect == 0x04)","ret && oldProtect == PAGE_READWRITE");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void
SmallHeapBlockT<MediumAllocationBlockAttributes>::ProtectUnusablePages()
{
    size_t count = this->GetUnusablePageCount();
    if (count > 0)
    {
        char* startPage = this->address + (MediumAllocationBlockAttributes::PageCount - count) * AutoSystemInfo::PageSize;
        DWORD oldProtect;
        BOOL ret = ::VirtualProtect(startPage, count * AutoSystemInfo::PageSize, PAGE_READONLY, &oldProtect);
        Assert(ret && oldProtect == PAGE_READWRITE);
#ifdef RECYCLER_WRITE_WATCH
        if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
        {
            ::ResetWriteWatch(startPage, count*AutoSystemInfo::PageSize);
        }
#endif
    }
}